

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              size_t size,char **err)

{
  pointer pHVar1;
  char **ppcVar2;
  EXRHeader ***pppEVar3;
  undefined4 in_EAX;
  int iVar4;
  char *pcVar5;
  EXRHeader **ppEVar6;
  EXRHeader *exr_header;
  ulong uVar7;
  int unaff_EBX;
  uchar *buf;
  int iVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  bool empty_header;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  string err_str;
  HeaderInfo info;
  bool local_139;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> local_138;
  char **local_118;
  string local_110;
  int *local_f0;
  EXRHeader ***local_e8;
  size_t local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  undefined1 local_b8 [24];
  pointer p_Stack_a0;
  pointer local_98;
  pointer p_Stack_90;
  int local_88 [18];
  ulong uStack_40;
  
  auVar11._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar11._4_4_ = -(uint)(memory == (uchar *)0x0);
  auVar11._8_4_ = -(uint)(num_headers == (int *)0x0);
  auVar11._12_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  iVar4 = movmskps(in_EAX,auVar11);
  if (iVar4 == 0) {
    local_e8 = exr_headers;
    if (size < 8) {
      local_b8._0_8_ = (pointer)(local_b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Data size too short","");
      if (err != (char **)0x0) {
        pcVar5 = strdup((char *)local_b8._0_8_);
        *err = pcVar5;
      }
      if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_,
                        (ulong)((long)&(((string *)local_b8._16_8_)->_M_dataplus)._M_p + 1));
      }
      iVar4 = -4;
    }
    else {
      buf = memory + 8;
      local_e0 = size - 8;
      local_138.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118 = err;
      local_f0 = num_headers;
      do {
        p_Stack_90 = (pointer)0x0;
        p_Stack_a0 = (pointer)0x0;
        local_b8._16_8_ = (pointer)0x0;
        local_b8._0_8_ = (pointer)0x0;
        local_b8._8_8_ = (pointer)0x0;
        local_98 = (pointer)0x0;
        local_88[0x10] = 0;
        local_88[0x11] = 0;
        uStack_40 = 0;
        local_88[0xc] = 0;
        local_88[0xd] = 0;
        local_88[0xe] = 0;
        local_88[0xf] = 0;
        local_88[8] = 0;
        local_88[9] = 0;
        local_88[10] = 0;
        local_88[0xb] = 0;
        local_88[4] = 0;
        local_88[5] = 0;
        local_88[6] = 0;
        local_88[7] = 0;
        local_88[0] = 0;
        local_88[1] = 0;
        local_88[2] = 0;
        local_88[3] = 0;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        local_110._M_string_length = 0;
        local_110.field_2._M_local_buf[0] = '\0';
        local_139 = false;
        iVar4 = tinyexr::ParseEXRHeader
                          ((HeaderInfo *)local_b8,&local_139,exr_version,&local_110,buf,local_e0);
        ppcVar2 = local_118;
        if (iVar4 == 0) {
          iVar4 = unaff_EBX;
          if (local_139 == true) {
            buf = buf + 1;
            iVar8 = 2;
          }
          else if (local_88[0xd] == 0) {
            local_d8[0] = local_c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,"`chunkCount\' attribute is not found in the header.","");
            ppcVar2 = local_118;
            if (local_118 != (char **)0x0) {
              pcVar5 = strdup((char *)local_d8[0]);
              *ppcVar2 = pcVar5;
            }
            if (local_d8[0] != local_c8) {
              operator_delete(local_d8[0],local_c8[0] + 1);
            }
            iVar4 = -4;
            iVar8 = 1;
          }
          else {
            std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                      (&local_138,(value_type *)local_b8);
            buf = buf + (uStack_40 & 0xffffffff);
            iVar8 = 0;
          }
        }
        else {
          iVar8 = 1;
          if (local_118 != (char **)0x0) {
            pcVar5 = strdup(local_110._M_dataplus._M_p);
            *ppcVar2 = pcVar5;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                   local_110.field_2._M_local_buf[0]) + 1);
        }
        if (p_Stack_a0 != (pointer)0x0) {
          operator_delete(p_Stack_a0,(long)p_Stack_90 - (long)p_Stack_a0);
        }
        std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::~vector
                  ((vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *)local_b8);
        unaff_EBX = iVar4;
      } while (iVar8 == 0);
      if (iVar8 == 2) {
        ppEVar6 = (EXRHeader **)
                  malloc((long)local_138.
                               super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_138.
                               super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
        pppEVar3 = local_e8;
        *local_e8 = ppEVar6;
        if (local_138.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_138.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar7 = 0;
        }
        else {
          lVar9 = 0;
          uVar10 = 0;
          do {
            pHVar1 = local_138.
                     super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            exr_header = (EXRHeader *)malloc(0x88);
            tinyexr::ConvertHeader
                      (exr_header,(HeaderInfo *)((long)pHVar1->data_window + lVar9 + -0x30));
            exr_header->tiled = exr_version->tiled;
            (*pppEVar3)[uVar10] = exr_header;
            uVar10 = uVar10 + 1;
            uVar7 = (long)local_138.
                          super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_138.
                          super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 7;
            lVar9 = lVar9 + 0x80;
          } while (uVar10 < uVar7);
        }
        *local_f0 = (int)uVar7;
        iVar4 = 0;
      }
      std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector(&local_138);
    }
  }
  else {
    local_b8._0_8_ = (pointer)(local_b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Invalid argument for ParseEXRMultipartHeaderFromMemory","");
    if (err != (char **)0x0) {
      pcVar5 = strdup((char *)local_b8._0_8_);
      *err = pcVar5;
    }
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,
                      (ulong)((long)&(((string *)local_b8._16_8_)->_M_dataplus)._M_p + 1));
    }
    iVar4 = -3;
  }
  return iVar4;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory, size_t size,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Data size too short", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {
      tinyexr::SetErrorMessage(err_str, err);
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {
      tinyexr::SetErrorMessage(
          "`chunkCount' attribute is not found in the header.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
    size -= info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));
  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));

    ConvertHeader(exr_header, infos[i]);

    // transfoer `tiled` from version.
    exr_header->tiled = exr_version->tiled;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return TINYEXR_SUCCESS;
}